

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_mv_merge.c
# Opt level: O3

void ihevcd_mv_merge(mv_ctxt_t *ps_mv_ctxt,UWORD32 *pu4_top_pu_idx,UWORD32 *pu4_left_pu_idx,
                    WORD32 left_nbr_4x4_strd,pu_t *ps_pu,WORD32 part_mode,WORD32 part_idx,
                    WORD32 part_wd,WORD32 part_ht,WORD32 part_pos_x,WORD32 part_pos_y,
                    WORD32 single_mcl_flag,WORD32 lb_avail,WORD32 l_avail,WORD32 tr_avail,
                    WORD32 t_avail,WORD32 tl_avail)

{
  int iVar1;
  byte bVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  undefined4 uVar7;
  bool bVar8;
  WORD8 WVar9;
  mv_t mVar10;
  mv_t mVar11;
  char cVar12;
  WORD8 WVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  undefined4 uVar19;
  undefined8 uVar18;
  long lVar20;
  pu_t *ps_pu_2;
  WORD8 WVar21;
  int iVar22;
  pu_t *ps_pu_1;
  long lVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  pu_t *ps_pu_2_00;
  pu_t *ppVar27;
  bool bVar28;
  bool bVar29;
  WORD32 avail_col_flag [2];
  pu_t as_pu_merge_list [5];
  uint local_e8;
  int local_e0;
  mv_t local_c8;
  undefined4 uStack_c4;
  pu_t *local_c0;
  uint *local_b8;
  int local_b0 [3];
  int local_a4;
  slice_header_t *local_a0;
  long local_98;
  long local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  UWORD32 *local_38;
  
  local_a0 = ps_mv_ctxt->ps_slice_hdr;
  local_98 = 0x4f8;
  local_90 = 0x378;
  if (local_a0->i1_slice_type == '\x01') {
    local_98 = 0x378;
  }
  ppVar27 = ps_mv_ctxt->ps_pic_pu;
  ps_pu_1 = ppVar27 + (int)pu4_left_pu_idx[(part_ht + -1 >> 2) * left_nbr_4x4_strd];
  bVar2 = ps_mv_ctxt->ps_pps->i1_log2_parallel_merge_level;
  iVar22 = part_pos_x + -1;
  if (l_avail == 0) {
    iVar14 = part_pos_x >> (bVar2 & 0x1f);
    local_e0 = part_pos_y >> (bVar2 & 0x1f);
    local_e8 = *(uint *)&ps_pu->field_0xc;
    uVar24 = local_e8 >> 0x14 & 7;
    uVar25 = 0;
    bVar29 = true;
  }
  else {
    iVar14 = part_pos_x >> (bVar2 & 0x1f);
    local_e0 = part_pos_y >> (bVar2 & 0x1f);
    local_e8 = *(uint *)&ps_pu->field_0xc;
    uVar24 = local_e8 >> 0x14 & 7;
    bVar29 = true;
    if ((((ps_pu_1->field_0xe & 1) == 0) &&
        (part_ht + part_pos_y + -1 >> (bVar2 & 0x1f) != local_e0 ||
         iVar22 >> (bVar2 & 0x1f) != iVar14)) &&
       ((part_idx != 1 || single_mcl_flag != 0 ||
        ((7 < (uint)part_mode || ((0xc4U >> (part_mode & 0x1fU) & 1) == 0)))))) {
      uStack_80 = *(undefined8 *)&(ps_pu_1->mv).i1_l0_ref_idx;
      local_88._0_2_ = (ps_pu_1->mv).s_l0_mv.i2_mvx;
      local_88._2_2_ = (ps_pu_1->mv).s_l0_mv.i2_mvy;
      local_88._4_2_ = (ps_pu_1->mv).s_l1_mv.i2_mvx;
      local_88._6_2_ = (ps_pu_1->mv).s_l1_mv.i2_mvy;
      if (uVar24 == 0) {
        mVar10 = (ps_pu_1->mv).s_l0_mv;
        mVar11 = (ps_pu_1->mv).s_l1_mv;
        WVar13 = (ps_pu_1->mv).i1_l1_ref_idx;
        WVar21 = (ps_pu_1->mv).i1_l0_ref_pic_buf_id;
        WVar9 = (ps_pu_1->mv).i1_l1_ref_pic_buf_id;
        (ps_pu->mv).i1_l0_ref_idx = (ps_pu_1->mv).i1_l0_ref_idx;
        (ps_pu->mv).i1_l1_ref_idx = WVar13;
        (ps_pu->mv).i1_l0_ref_pic_buf_id = WVar21;
        (ps_pu->mv).i1_l1_ref_pic_buf_id = WVar9;
        (ps_pu->mv).s_l0_mv = mVar10;
        (ps_pu->mv).s_l1_mv = mVar11;
        uStack_80._4_4_ = (uint)((ulong)uStack_80 >> 0x20);
        *(uint *)&ps_pu->field_0xc = local_e8 & 0xfff9ffff | uStack_80._4_4_ & 0x60000;
        return;
      }
      uVar25 = 1;
      bVar29 = false;
    }
    else {
      uVar25 = 0;
    }
  }
  local_b8 = (uint *)&ps_pu->field_0xc;
  iVar1 = part_pos_y + -1;
  ps_pu_2_00 = ppVar27 + (int)pu4_top_pu_idx[part_wd + -1 >> 2];
  bVar28 = true;
  uVar15 = uVar25;
  if ((t_avail == 0) || ((*(uint *)&ps_pu_2_00->field_0xc >> 0x10 & 1) != 0)) {
    bVar8 = false;
    bVar28 = true;
  }
  else if (iVar1 >> (bVar2 & 0x1f) == local_e0 &&
           part_pos_x + part_wd + -1 >> (bVar2 & 0x1f) == iVar14) {
    bVar8 = false;
  }
  else if (((part_idx == 1 && single_mcl_flag == 0) && ((uint)part_mode < 6)) &&
          ((0x32U >> (part_mode & 0x1fU) & 1) != 0)) {
    bVar8 = false;
  }
  else {
    if (bVar29) {
      uVar15 = uVar25 + 1;
    }
    else {
      uVar16 = ihevcd_compare_pu_t(ps_pu_1,ps_pu_2_00);
      uVar15 = (uVar16 ^ 1) + uVar25;
      if (uVar16 != 0) {
        bVar8 = true;
        bVar28 = false;
        goto LAB_0011f206;
      }
    }
    uVar17 = (ulong)(uVar25 << 4);
    uVar18 = *(undefined8 *)&(ps_pu_2_00->mv).i1_l0_ref_idx;
    *(undefined8 *)((long)&local_88 + uVar17) = *(undefined8 *)&ps_pu_2_00->mv;
    *(undefined8 *)((long)&uStack_80 + uVar17) = uVar18;
    if (uVar25 == uVar24) {
      uVar18._0_2_ = (ps_pu_2_00->mv).s_l0_mv.i2_mvx;
      uVar18._2_2_ = (ps_pu_2_00->mv).s_l0_mv.i2_mvy;
      uVar18._4_2_ = (ps_pu_2_00->mv).s_l1_mv.i2_mvx;
      uVar18._6_2_ = (ps_pu_2_00->mv).s_l1_mv.i2_mvy;
      uVar19._0_1_ = (ps_pu_2_00->mv).i1_l0_ref_idx;
      uVar19._1_1_ = (ps_pu_2_00->mv).i1_l1_ref_idx;
      uVar19._2_1_ = (ps_pu_2_00->mv).i1_l0_ref_pic_buf_id;
      uVar19._3_1_ = (ps_pu_2_00->mv).i1_l1_ref_pic_buf_id;
      goto LAB_0011f89d;
    }
    uVar25 = uVar25 + 1;
    bVar8 = true;
    bVar28 = false;
  }
LAB_0011f206:
  local_a4 = part_pos_x + part_wd;
  if (((tr_avail != 0) &&
      (ps_pu_2 = ppVar27 + (int)pu4_top_pu_idx[part_wd >> 2],
      (*(uint *)&ps_pu_2->field_0xc >> 0x10 & 1) == 0)) &&
     (iVar1 >> (bVar2 & 0x1f) != local_e0 || local_a4 >> (bVar2 & 0x1f) != iVar14)) {
    if (bVar28) {
      uVar15 = uVar15 + 1;
    }
    else {
      local_c0 = ppVar27;
      local_38 = pu4_left_pu_idx;
      uVar16 = ihevcd_compare_pu_t(ps_pu_2_00,ps_pu_2);
      uVar15 = (uVar16 ^ 1) + uVar15;
      pu4_left_pu_idx = local_38;
      ppVar27 = local_c0;
      if (uVar16 != 0) goto LAB_0011f264;
    }
    uVar17 = (ulong)(uVar25 << 4);
    uVar18 = *(undefined8 *)&(ps_pu_2->mv).i1_l0_ref_idx;
    *(undefined8 *)((long)&local_88 + uVar17) = *(undefined8 *)&ps_pu_2->mv;
    *(undefined8 *)((long)&uStack_80 + uVar17) = uVar18;
    if (uVar25 != uVar24) {
      uVar25 = uVar25 + 1;
      goto LAB_0011f264;
    }
LAB_0011f7f4:
    uVar18._0_2_ = (ps_pu_2->mv).s_l0_mv.i2_mvx;
    uVar18._2_2_ = (ps_pu_2->mv).s_l0_mv.i2_mvy;
    uVar18._4_2_ = (ps_pu_2->mv).s_l1_mv.i2_mvx;
    uVar18._6_2_ = (ps_pu_2->mv).s_l1_mv.i2_mvy;
    uVar19._0_1_ = (ps_pu_2->mv).i1_l0_ref_idx;
    uVar19._1_1_ = (ps_pu_2->mv).i1_l1_ref_idx;
    uVar19._2_1_ = (ps_pu_2->mv).i1_l0_ref_pic_buf_id;
    uVar19._3_1_ = (ps_pu_2->mv).i1_l1_ref_pic_buf_id;
LAB_0011f89d:
    (ps_pu->mv).i1_l0_ref_idx = (char)uVar19;
    (ps_pu->mv).i1_l1_ref_idx = (char)((uint)uVar19 >> 8);
    (ps_pu->mv).i1_l0_ref_pic_buf_id = (char)((uint)uVar19 >> 0x10);
    (ps_pu->mv).i1_l1_ref_pic_buf_id = (char)((uint)uVar19 >> 0x18);
    uVar19 = (undefined4)((ulong)uVar18 >> 0x20);
    (ps_pu->mv).s_l0_mv.i2_mvx = (short)(int)uVar18;
    (ps_pu->mv).s_l0_mv.i2_mvy = (short)((uint)(int)uVar18 >> 0x10);
    (ps_pu->mv).s_l1_mv.i2_mvx = (short)uVar19;
    (ps_pu->mv).s_l1_mv.i2_mvy = (short)((uint)uVar19 >> 0x10);
    *(uint *)&ps_pu->field_0xc =
         local_e8 & 0xfff9ffff | *(uint *)((long)&uStack_80 + uVar17 + 4) & 0x60000;
    return;
  }
LAB_0011f264:
  if (((lb_avail != 0) &&
      (ps_pu_2 = ppVar27 + (int)pu4_left_pu_idx[(part_ht >> 2) * left_nbr_4x4_strd],
      (*(uint *)&ps_pu_2->field_0xc >> 0x10 & 1) == 0)) &&
     (part_pos_y + part_ht >> (bVar2 & 0x1f) != local_e0 || iVar22 >> (bVar2 & 0x1f) != iVar14)) {
    if (bVar29) {
      uVar15 = uVar15 + 1;
    }
    else {
      local_c0 = ppVar27;
      uVar16 = ihevcd_compare_pu_t(ps_pu_1,ps_pu_2);
      uVar15 = (uVar16 ^ 1) + uVar15;
      ppVar27 = local_c0;
      if (uVar16 != 0) goto LAB_0011f2bd;
    }
    uVar17 = (ulong)(uVar25 << 4);
    uVar18 = *(undefined8 *)&(ps_pu_2->mv).i1_l0_ref_idx;
    *(undefined8 *)((long)&local_88 + uVar17) = *(undefined8 *)&ps_pu_2->mv;
    *(undefined8 *)((long)&uStack_80 + uVar17) = uVar18;
    if (uVar25 == uVar24) goto LAB_0011f7f4;
    uVar25 = uVar25 + 1;
  }
LAB_0011f2bd:
  if ((((tl_avail != 0) &&
       (ppVar27 = ppVar27 + (int)pu4_top_pu_idx[-1], (ppVar27->field_0xe & 1) == 0)) &&
      (local_e0 != iVar1 >> (bVar2 & 0x1f) || iVar14 != iVar22 >> (bVar2 & 0x1f))) && (uVar15 != 4))
  {
    uVar15 = 1;
    if (!bVar29) {
      uVar15 = ihevcd_compare_pu_t(ps_pu_1,ppVar27);
      uVar15 = uVar15 ^ 1;
    }
    if (bVar8 && uVar15 != 0) {
      uVar15 = ihevcd_compare_pu_t(ps_pu_2_00,ppVar27);
      uVar15 = uVar15 ^ 1;
    }
    if (uVar15 != 0) {
      uVar17 = (ulong)(uVar25 << 4);
      uVar18 = *(undefined8 *)&(ppVar27->mv).i1_l0_ref_idx;
      *(undefined8 *)((long)&local_88 + uVar17) = *(undefined8 *)&ppVar27->mv;
      *(undefined8 *)((long)&uStack_80 + uVar17) = uVar18;
      if (uVar25 == uVar24) {
        uVar18._0_2_ = (ppVar27->mv).s_l0_mv.i2_mvx;
        uVar18._2_2_ = (ppVar27->mv).s_l0_mv.i2_mvy;
        uVar18._4_2_ = (ppVar27->mv).s_l1_mv.i2_mvx;
        uVar18._6_2_ = (ppVar27->mv).s_l1_mv.i2_mvy;
        uVar19._0_1_ = (ppVar27->mv).i1_l0_ref_idx;
        uVar19._1_1_ = (ppVar27->mv).i1_l1_ref_idx;
        uVar19._2_1_ = (ppVar27->mv).i1_l0_ref_pic_buf_id;
        uVar19._3_1_ = (ppVar27->mv).i1_l1_ref_pic_buf_id;
        goto LAB_0011f89d;
      }
      uVar25 = uVar25 + 1;
    }
  }
  local_b0[0] = 0;
  local_b0[1] = 0;
  ihevcd_collocated_mvp(ps_mv_ctxt,ps_pu,&local_c8,local_b0,0,local_a4,part_pos_y + part_ht);
  iVar22 = local_b0[0];
  iVar14 = local_b0[1];
  bVar29 = true;
  bVar28 = true;
  if (local_b0[0] != 0 || local_b0[1] != 0) {
    *(ulong *)((long)&local_88 + (ulong)(uVar25 << 4)) = CONCAT44(uStack_c4,local_c8);
    bVar28 = local_b0[0] == 0;
    bVar29 = local_b0[1] == 0;
    if (!bVar28 && !bVar29) {
      *(undefined2 *)((long)&uStack_80 + (ulong)(uVar25 << 4)) = 0;
      uVar15 = 0x40000;
      uVar16 = 1;
      goto LAB_0011f504;
    }
  }
  ihevcd_collocated_mvp
            (ps_mv_ctxt,ps_pu,&local_c8,local_b0,0,(part_wd >> 1) + part_pos_x,
             (part_ht >> 1) + part_pos_y);
  if (bVar28) {
    *(mv_t *)((long)&local_88 + (ulong)(uVar25 << 4)) = local_c8;
  }
  if (bVar29) {
    *(undefined4 *)((long)&local_88 + (ulong)(uVar25 << 4) + 4) = uStack_c4;
  }
  uVar15 = 0x20000;
  if (iVar22 != 0 || local_b0[0] != 0) {
    uVar15 = (uint)(iVar14 != 0 || local_b0[1] != 0) << 0x12;
  }
  *(undefined2 *)((long)&uStack_80 + (ulong)(uVar25 << 4)) = 0;
  uVar16 = (uint)((iVar14 != 0 || local_b0[1] != 0) || (iVar22 != 0 || local_b0[0] != 0));
LAB_0011f504:
  *(uint *)((long)&uStack_80 + (ulong)(uVar25 << 4) + 4) =
       *(uint *)((long)&uStack_80 + (ulong)(uVar25 << 4) + 4) & 0xfff9ffff | uVar15;
  uVar16 = uVar16 + uVar25;
  if (uVar16 == uVar24 + 1) {
    uVar17 = (ulong)(uVar24 << 4);
    uVar19 = *(undefined4 *)((long)&uStack_80 + uVar17);
    (ps_pu->mv).i1_l0_ref_idx = (char)uVar19;
    (ps_pu->mv).i1_l1_ref_idx = (char)((uint)uVar19 >> 8);
    (ps_pu->mv).i1_l0_ref_pic_buf_id = (char)((uint)uVar19 >> 0x10);
    (ps_pu->mv).i1_l1_ref_pic_buf_id = (char)((uint)uVar19 >> 0x18);
    uVar19 = (undefined4)*(undefined8 *)((long)&local_88 + uVar17);
    uVar7 = (undefined4)((ulong)*(undefined8 *)((long)&local_88 + uVar17) >> 0x20);
    (ps_pu->mv).s_l0_mv.i2_mvx = (short)uVar19;
    (ps_pu->mv).s_l0_mv.i2_mvy = (short)((uint)uVar19 >> 0x10);
    (ps_pu->mv).s_l1_mv.i2_mvx = (short)uVar7;
    (ps_pu->mv).s_l1_mv.i2_mvy = (short)((uint)uVar7 >> 0x10);
    *(uint *)&ps_pu->field_0xc =
         *(uint *)&ps_pu->field_0xc & 0xfff9ffff |
         *(uint *)((long)&uStack_80 + uVar17 + 4) & 0x60000;
    return;
  }
  if (uVar16 - 2 < 3 && local_a0->i1_slice_type == '\0') {
    uVar17 = (ulong)((uVar16 - 1) * uVar16);
    lVar23 = 0;
    while (uVar17 << 2 != lVar23) {
      lVar26 = (long)*(int *)((long)&DAT_00173030 + lVar23);
      if (((*(uint *)((long)&uStack_80 + lVar26 * 0x10 + 4) & 0x60000) != 0x20000) &&
         (lVar20 = (long)*(int *)((long)&DAT_00173060 + lVar23) * 0x10,
         (*(byte *)((long)&uStack_80 + lVar20 + 6) & 6) != 0)) {
        cVar3 = *(char *)(&uStack_80 + lVar26 * 2);
        cVar12 = *(char *)((long)&uStack_80 + lVar20 + 1);
        sVar4 = *(short *)((long)&local_88 + lVar26 * 0x10 + 2);
        sVar5 = *(short *)((long)&local_88 + lVar20 + 4);
        sVar6 = *(short *)((long)&local_88 + lVar20 + 6);
        if ((*(int *)(*(long *)((long)local_a0->ai4_poc_lsb_lt + (long)cVar3 * 0x18 + local_90 + -8)
                     + 0x10) !=
             *(int *)(*(long *)((long)local_a0->ai4_poc_lsb_lt + (long)cVar12 * 0x18 + local_98 + -8
                               ) + 0x10)) ||
           ((*(short *)(&local_88 + lVar26 * 2) != sVar5 || (sVar4 != sVar6)))) {
          if (uVar16 == uVar24) {
            (ps_pu->mv).s_l0_mv.i2_mvx = *(short *)(&local_88 + lVar26 * 2);
            (ps_pu->mv).s_l0_mv.i2_mvy = sVar4;
            (ps_pu->mv).s_l1_mv.i2_mvx = sVar5;
            (ps_pu->mv).s_l1_mv.i2_mvy = sVar6;
            (ps_pu->mv).i1_l0_ref_idx = cVar3;
            (ps_pu->mv).i1_l1_ref_idx = cVar12;
            *(uint *)&ps_pu->field_0xc = *(uint *)&ps_pu->field_0xc & 0xfff9ffff | 0x40000;
            return;
          }
          uVar16 = uVar16 + 1;
        }
      }
      if ((uVar17 * 4 + -4 == lVar23) || (lVar23 = lVar23 + 4, uVar16 == 5)) break;
    }
  }
  iVar22 = uVar24 - uVar16;
  cVar3 = local_a0->i1_num_ref_idx_l0_active;
  if (local_a0->i1_slice_type == '\x01') {
    if (cVar3 <= iVar22) {
      iVar22 = 0;
    }
    WVar21 = (WORD8)iVar22;
    uVar24 = *local_b8 & 0xfff9ffff;
    WVar13 = '\0';
  }
  else {
    cVar12 = local_a0->i1_num_ref_idx_l1_active;
    if (cVar3 < local_a0->i1_num_ref_idx_l1_active) {
      cVar12 = cVar3;
    }
    iVar14 = 0;
    if (iVar22 < cVar12) {
      iVar14 = iVar22;
    }
    uVar24 = *local_b8 & 0xfff9ffff | 0x40000;
    WVar21 = (WORD8)iVar14;
    WVar13 = WVar21;
  }
  (ps_pu->mv).i1_l0_ref_idx = WVar21;
  (ps_pu->mv).i1_l1_ref_idx = WVar13;
  *(uint *)&ps_pu->field_0xc = uVar24;
  (ps_pu->mv).s_l0_mv.i2_mvx = 0;
  (ps_pu->mv).s_l0_mv.i2_mvy = 0;
  (ps_pu->mv).s_l1_mv.i2_mvx = 0;
  (ps_pu->mv).s_l1_mv.i2_mvy = 0;
  return;
}

Assistant:

void ihevcd_mv_merge(mv_ctxt_t *ps_mv_ctxt,
                     UWORD32 *pu4_top_pu_idx,
                     UWORD32 *pu4_left_pu_idx,
                     WORD32 left_nbr_4x4_strd,
                     pu_t *ps_pu,
                     WORD32 part_mode,
                     WORD32 part_idx,
                     WORD32 part_wd,
                     WORD32 part_ht,
                     WORD32 part_pos_x,
                     WORD32 part_pos_y,
                     WORD32 single_mcl_flag,
                     WORD32 lb_avail,
                     WORD32 l_avail,
                     WORD32 tr_avail,
                     WORD32 t_avail,
                     WORD32 tl_avail)
{
    /******************************************************/
    /*      Spatial Merge Candidates                      */
    /******************************************************/
    slice_header_t *ps_slice_hdr;
    pu_t as_pu_merge_list[MAX_NUM_MERGE_CAND];
    pps_t *ps_pps;
    ref_list_t *ps_ref_list[2];
    WORD32 sum_avail_a0_a1_b0_b1 = 0; /*Sum of availability of A0, A1, B0, B1*/
    WORD32 nbr_x, nbr_y;
    WORD32 nbr_avail[MAX_NUM_MV_NBR];
    WORD32 merge_shift;
    WORD32 nbr_pu_idx;
    pu_t *ps_nbr_pu[MAX_NUM_MV_NBR];
    WORD32 max_num_merge_cand;
    WORD32 candidate_cnt;
    WORD32 pos_x_merge_shift, pos_y_merge_shift;

    ps_slice_hdr = ps_mv_ctxt->ps_slice_hdr;
    ps_pps = ps_mv_ctxt->ps_pps;
    /* Initializing reference list */
    ps_ref_list[0] = ps_slice_hdr->as_ref_pic_list0;
    ps_ref_list[1] = ps_slice_hdr->as_ref_pic_list1;
    if(PSLICE == ps_slice_hdr->i1_slice_type)
        ps_ref_list[1] = ps_slice_hdr->as_ref_pic_list0;

    candidate_cnt = 0;
    /*******************************************/
    /* Neighbor location: Graphical indication */
    /*                                         */
    /*          B2 _____________B1 B0          */
    /*            |               |            */
    /*            |               |            */
    /*            |               |            */
    /*            |      PU     ht|            */
    /*            |               |            */
    /*            |               |            */
    /*          A1|______wd_______|            */
    /*          A0                             */
    /*                                         */
    /*******************************************/

    merge_shift = ps_pps->i1_log2_parallel_merge_level;

    /* Availability check */
    /* A1 */
    nbr_x = part_pos_x - 1;
    nbr_y = part_pos_y + part_ht - 1; /* A1 */

    nbr_pu_idx = *(pu4_left_pu_idx + ((nbr_y - part_pos_y) >> 2) * left_nbr_4x4_strd);
    ps_nbr_pu[NBR_A1] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_A1] = l_avail
                    && (!ps_nbr_pu[NBR_A1]->b1_intra_flag); /* A1 */

    pos_x_merge_shift = (part_pos_x >> merge_shift);
    pos_y_merge_shift = (part_pos_y >> merge_shift);
    max_num_merge_cand = ps_pu->b3_merge_idx + 1;

    {
        if(nbr_avail[NBR_A1])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
               (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_A1] = 0;
            }

            /* SPEC JCTVC-K1003_v9 version has a different way using not available       */
            /* candidates compared to software. for non square part and seconf part case */
            /* ideally nothing from the 1st partition should be used as per spec but     */
            /* HM 8.2 dev verison does not adhere to this. currenlty code fllows HM      */

            /* if single MCL is 0 , second part of 2 part in CU */
            else if((single_mcl_flag == 0) && (part_idx == 1) &&
                            ((part_mode == PART_Nx2N) || (part_mode == PART_nLx2N) ||
                                            (part_mode == PART_nRx2N)))
            {
                nbr_avail[NBR_A1] = 0;
            }
            sum_avail_a0_a1_b0_b1 += nbr_avail[NBR_A1];
            if(nbr_avail[NBR_A1])
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_A1];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }

    /* B1 */
    nbr_x = part_pos_x + part_wd - 1;
    nbr_y = part_pos_y - 1;

    nbr_pu_idx = *(pu4_top_pu_idx + ((nbr_x - part_pos_x) >> 2));
    ps_nbr_pu[NBR_B1] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_B1] = t_avail
                    && (!ps_nbr_pu[NBR_B1]->b1_intra_flag); /* B1 */

    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_B1];

        if(nbr_avail[NBR_B1])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
               (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_B1] = 0;
                avail_flag = 0;
            }

            /* if single MCL is 0 , second part of 2 part in CU */
            else if((single_mcl_flag == 0) && (part_idx == 1) &&
                            ((part_mode == PART_2NxN) || (part_mode == PART_2NxnU) ||
                                            (part_mode == PART_2NxnD)))
            {
                nbr_avail[NBR_B1] = 0;
                avail_flag = 0;
            }

            else if(nbr_avail[NBR_A1])
            {
                avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_A1], ps_nbr_pu[NBR_B1]);
            }

            sum_avail_a0_a1_b0_b1 += avail_flag;
            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_B1];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }
    /* B0 */
    nbr_x = part_pos_x + part_wd;
    nbr_y = part_pos_y - 1;

    nbr_pu_idx = *(pu4_top_pu_idx + ((nbr_x - part_pos_x) >> 2));
    ps_nbr_pu[NBR_B0] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_B0] = tr_avail
                    && (!ps_nbr_pu[NBR_B0]->b1_intra_flag); /* B0 */

    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_B0];

        /* if at same merge level */
        if(nbr_avail[NBR_B0])
        {
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
               (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_B0] = 0;
                avail_flag = 0;
            }
            else if(nbr_avail[NBR_B1])
            {
                avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_B1], ps_nbr_pu[NBR_B0]);
            }

            sum_avail_a0_a1_b0_b1 += avail_flag;
            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_B0];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }
    /* A0 */
    nbr_x = part_pos_x - 1;
    nbr_y = part_pos_y + part_ht; /* A0 */

    nbr_pu_idx = *(pu4_left_pu_idx + ((nbr_y - part_pos_y) >> 2) * left_nbr_4x4_strd);
    ps_nbr_pu[NBR_A0] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_A0] = lb_avail
                    && (!ps_nbr_pu[NBR_A0]->b1_intra_flag); /* A0 */
    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_A0];

        if(nbr_avail[NBR_A0])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
                            (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_A0] = 0;
                avail_flag = 0;
            }
            else if(nbr_avail[NBR_A1])
            {
                avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_A1], ps_nbr_pu[NBR_A0]);
            }

            sum_avail_a0_a1_b0_b1 += avail_flag;
            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_A0];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }
    /* B2 */

    nbr_x = part_pos_x - 1;
    nbr_y = part_pos_y - 1; /* B2 */

    nbr_pu_idx = *(pu4_top_pu_idx + ((nbr_x - part_pos_x) >> 2));
    ps_nbr_pu[NBR_B2] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_B2] = tl_avail
                    && (!ps_nbr_pu[NBR_B2]->b1_intra_flag); /* B2 */

    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_B2];

        if(nbr_avail[NBR_B2])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
                            (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_B2] = 0;
                avail_flag = 0;
            }
            else if(4 == sum_avail_a0_a1_b0_b1)
            {
                avail_flag = 0;
            }

            else
            {
                if(nbr_avail[NBR_A1])
                {
                    avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_A1], ps_nbr_pu[NBR_B2]);
                }

                if(avail_flag && nbr_avail[NBR_B1])
                {
                    avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_B1], ps_nbr_pu[NBR_B2]);
                }
            }

            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_B2];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }

    /***********************************************************/
    /*          Collocated MV prediction                       */
    /***********************************************************/
    {
        mv_t as_mv_col[2];
        WORD32 avail_col_flag[2] = { 0 }, x_col, y_col;
        WORD32 avail_col_l0, avail_col_l1;
//        ihevcd_collocated_mvp(ps_mv_ctxt,ps_pu,part_pos_x,part_pos_y,part_wd,part_ht,as_mv_col,avail_col_flag,0);

        /* Checking Collocated MV availability at Bottom right of PU*/
        x_col = part_pos_x + part_wd;
        y_col = part_pos_y + part_ht;
        ihevcd_collocated_mvp(ps_mv_ctxt, ps_pu, as_mv_col, avail_col_flag, 0, x_col, y_col);

        avail_col_l0 = avail_col_flag[0];
        avail_col_l1 = avail_col_flag[1];

        if(avail_col_l0 || avail_col_l1)
        {
            as_pu_merge_list[candidate_cnt].mv.s_l0_mv = as_mv_col[0];
            as_pu_merge_list[candidate_cnt].mv.s_l1_mv = as_mv_col[1];
        }

        if(avail_col_l0 == 0 || avail_col_l1 == 0)
        {
            /* Checking Collocated MV availability at Center of PU */
            x_col = part_pos_x + (part_wd >> 1);
            y_col = part_pos_y + (part_ht >> 1);
            ihevcd_collocated_mvp(ps_mv_ctxt, ps_pu, as_mv_col, avail_col_flag, 0, x_col, y_col);

            if(avail_col_l0 == 0)
            {
                as_pu_merge_list[candidate_cnt].mv.s_l0_mv = as_mv_col[0];
            }
            if(avail_col_l1 == 0)
            {
                as_pu_merge_list[candidate_cnt].mv.s_l1_mv = as_mv_col[1];
            }

            avail_col_l0 |= avail_col_flag[0];
            avail_col_l1 |= avail_col_flag[1];
        }

        as_pu_merge_list[candidate_cnt].mv.i1_l0_ref_idx = 0;
        as_pu_merge_list[candidate_cnt].mv.i1_l1_ref_idx = 0;
        as_pu_merge_list[candidate_cnt].b2_pred_mode = avail_col_l0 ? (avail_col_l1 ? PRED_BI : PRED_L0) : PRED_L1;

        candidate_cnt += (avail_col_l0 || avail_col_l1);

        if(candidate_cnt == max_num_merge_cand)
        {
            ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
            ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
            return;
        }

    }
    {
        WORD32 slice_type;

        slice_type = ps_slice_hdr->i1_slice_type;
        /* Colocated mv has to be added to list, if available */

        /******************************************************/
        /*      Bi pred merge candidates                      */
        /******************************************************/
        if(slice_type == BSLICE)
        {
            if((candidate_cnt > 1) && (candidate_cnt < MAX_NUM_MERGE_CAND))
            {
                WORD32 priority_list0[12] =
                    { 0, 1, 0, 2, 1, 2, 0, 3, 1, 3, 2, 3 };
                WORD32 priority_list1[12] =
                    { 1, 0, 2, 0, 2, 1, 3, 0, 3, 1, 3, 2 };
                WORD32 l0_cand, l1_cand;
                WORD32 bi_pred_idx = 0;
                WORD32 total_bi_pred_cand =
                                candidate_cnt * (candidate_cnt - 1);

                while(bi_pred_idx < total_bi_pred_cand)
                {
                    l0_cand = priority_list0[bi_pred_idx];
                    l1_cand = priority_list1[bi_pred_idx];

                    if((as_pu_merge_list[l0_cand].b2_pred_mode != PRED_L1)
                                    && (as_pu_merge_list[l1_cand].b2_pred_mode
                                                    != PRED_L0))
                    {
                        WORD8 i1_l0_ref_idx, i1_l1_ref_idx;
                        mv_t s_l0_mv, s_l1_mv;
                        pic_buf_t *ps_pic_buf_l0, *ps_pic_buf_l1;

                        i1_l0_ref_idx = as_pu_merge_list[l0_cand].mv.i1_l0_ref_idx;
                        i1_l1_ref_idx = as_pu_merge_list[l1_cand].mv.i1_l1_ref_idx;
                        ps_pic_buf_l0 = (pic_buf_t *)((ps_ref_list[0][i1_l0_ref_idx].pv_pic_buf));
                        ps_pic_buf_l1 = (pic_buf_t *)((ps_ref_list[1][i1_l1_ref_idx].pv_pic_buf));
                        s_l0_mv = as_pu_merge_list[l0_cand].mv.s_l0_mv;
                        s_l1_mv = as_pu_merge_list[l1_cand].mv.s_l1_mv;

                        if((ps_pic_buf_l0->i4_abs_poc != ps_pic_buf_l1->i4_abs_poc)
                                        || (s_l0_mv.i2_mvx != s_l1_mv.i2_mvx)
                                        || (s_l0_mv.i2_mvy != s_l1_mv.i2_mvy))
                        {
                            candidate_cnt++;
                            if(candidate_cnt == max_num_merge_cand)
                            {
                                ps_pu[0].mv.s_l0_mv = s_l0_mv;
                                ps_pu[0].mv.s_l1_mv = s_l1_mv;
                                ps_pu[0].mv.i1_l0_ref_idx = i1_l0_ref_idx;
                                ps_pu[0].mv.i1_l1_ref_idx = i1_l1_ref_idx;
                                ps_pu[0].b2_pred_mode = PRED_BI;
                                return;
                            }
                        }
                    }

                    bi_pred_idx++;

                    if((bi_pred_idx == total_bi_pred_cand)
                                    || (candidate_cnt == MAX_NUM_MERGE_CAND))
                    {
                        break;
                    }
                }
            }
        }

        /******************************************************/
        /*      Zero merge candidates                         */
        /******************************************************/
//        if(candidate_cnt < max_num_merge_cand)
        {
            WORD32 num_ref_idx;
            WORD32 zero_idx;

            zero_idx = max_num_merge_cand - candidate_cnt - 1;

            if(slice_type == PSLICE)
                num_ref_idx = ps_slice_hdr->i1_num_ref_idx_l0_active;
            else
                /* Slice type B */
                num_ref_idx = MIN(ps_slice_hdr->i1_num_ref_idx_l0_active, ps_slice_hdr->i1_num_ref_idx_l1_active);

            if(zero_idx >= num_ref_idx)
                zero_idx = 0;

            ps_pu[0].mv.i1_l0_ref_idx = zero_idx;
            if(slice_type == PSLICE)
            {
                ps_pu[0].mv.i1_l1_ref_idx = 0;
                ps_pu[0].b2_pred_mode = PRED_L0;
            }
            else /* Slice type B */
            {
                ps_pu[0].mv.i1_l1_ref_idx = zero_idx;
                ps_pu[0].b2_pred_mode = PRED_BI;
            }

            ps_pu[0].mv.s_l0_mv.i2_mvx = 0;
            ps_pu[0].mv.s_l0_mv.i2_mvy = 0;
            ps_pu[0].mv.s_l1_mv.i2_mvx = 0;
            ps_pu[0].mv.s_l1_mv.i2_mvy = 0;

            candidate_cnt++;
        }
    }

    return;
}